

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialJPDPValuePair.cpp
# Opt level: O0

void __thiscall
PartialJPDPValuePair::PartialJPDPValuePair(PartialJPDPValuePair *this,PartialJPDPValuePair *o)

{
  type pPVar1;
  long in_RSI;
  undefined8 *in_RDI;
  PartialJointPolicyValuePair *in_stack_ffffffffffffff88;
  PartialJointPolicyValuePair *in_stack_ffffffffffffff90;
  shared_ptr<BGCG_Solver> *r;
  shared_ptr<BGCG_Solver> *this_00;
  PartialJointPolicyDiscretePure *p;
  shared_ptr<PartialJointPolicyDiscretePure> *this_01;
  
  PartialJointPolicyValuePair::PartialJointPolicyValuePair
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  *in_RDI = &PTR__PartialJPDPValuePair_00d13aa0;
  r = (shared_ptr<BGCG_Solver> *)(in_RDI + 2);
  boost::shared_ptr<PartialJointPolicyDiscretePure>::shared_ptr
            ((shared_ptr<PartialJointPolicyDiscretePure> *)0x97b003);
  this_00 = (shared_ptr<BGCG_Solver> *)(in_RDI + 4);
  boost::shared_ptr<BayesianGameIdenticalPayoffSolver>::shared_ptr
            ((shared_ptr<BayesianGameIdenticalPayoffSolver> *)0x97b016);
  p = (PartialJointPolicyDiscretePure *)(in_RDI + 6);
  boost::shared_ptr<BGCG_Solver>::shared_ptr((shared_ptr<BGCG_Solver> *)0x97b029);
  this_01 = (shared_ptr<PartialJointPolicyDiscretePure> *)(in_RDI + 8);
  boost::shared_ptr<BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector>_>::shared_ptr
            ((shared_ptr<BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector>_> *)0x97b03c);
  boost::shared_ptr<BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVectorForClusteredBG>_>::
  shared_ptr((shared_ptr<BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVectorForClusteredBG>_>
              *)0x97b04f);
  pPVar1 = boost::shared_ptr<PartialJointPolicyDiscretePure>::operator->
                     ((shared_ptr<PartialJointPolicyDiscretePure> *)(in_RSI + 0x10));
  (*(pPVar1->super_JointPolicyDiscretePure).super_JointPolicyDiscrete.super_JointPolicy.
    _vptr_JointPolicy[5])();
  boost::shared_ptr<PartialJointPolicyDiscretePure>::shared_ptr<PartialJointPolicyDiscretePure>
            (this_01,p);
  boost::shared_ptr<PartialJointPolicyDiscretePure>::operator=
            ((shared_ptr<PartialJointPolicyDiscretePure> *)this_00,
             (shared_ptr<PartialJointPolicyDiscretePure> *)r);
  boost::shared_ptr<PartialJointPolicyDiscretePure>::~shared_ptr
            ((shared_ptr<PartialJointPolicyDiscretePure> *)0x97b0a7);
  boost::shared_ptr<BayesianGameIdenticalPayoffSolver>::operator=
            ((shared_ptr<BayesianGameIdenticalPayoffSolver> *)this_00,
             (shared_ptr<BayesianGameIdenticalPayoffSolver> *)r);
  boost::shared_ptr<BGCG_Solver>::operator=(this_00,r);
  boost::shared_ptr<BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector>_>::operator=
            ((shared_ptr<BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector>_> *)this_00,
             (shared_ptr<BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector>_> *)r);
  boost::shared_ptr<BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVectorForClusteredBG>_>::
  operator=((shared_ptr<BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVectorForClusteredBG>_> *
            )this_00,(shared_ptr<BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVectorForClusteredBG>_>
                      *)r);
  return;
}

Assistant:

PartialJPDPValuePair::PartialJPDPValuePair(const PartialJPDPValuePair& o) :
    PartialJointPolicyValuePair(o)
{
    _m_jpol = PJPDP_sharedPtr(o._m_jpol->Clone());
    _m_bgip_solver = o._m_bgip_solver;
    _m_bgcg_solver = o._m_bgcg_solver;    
    _m_bgip_solver_T = o._m_bgip_solver_T;
    _m_bgip_solver_TC = o._m_bgip_solver_TC;    
}